

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O2

void Bozo_sort(int *arr,int len,Order type)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  int i_1;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"BOZO ARR");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (type == DESC) {
    uVar6 = 0;
    if (0 < len) {
      uVar6 = (ulong)(uint)len;
    }
    while (bVar2 = is_sort(arr,len,DESC), !bVar2) {
      iVar3 = rand();
      iVar3 = iVar3 % len;
      iVar4 = rand();
      iVar4 = iVar4 % (len + -1);
      iVar4 = (uint)(iVar3 <= iVar4) + iVar4;
      iVar1 = arr[iVar3];
      arr[iVar3] = arr[iVar4];
      arr[iVar4] = iVar1;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[uVar7]);
        std::operator<<(poVar5,' ');
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  else if (type == ABC) {
    uVar6 = 0;
    if (0 < len) {
      uVar6 = (ulong)(uint)len;
    }
    while (bVar2 = is_sort(arr,len,ABC), !bVar2) {
      iVar3 = rand();
      iVar3 = iVar3 % len;
      iVar4 = rand();
      iVar4 = iVar4 % (len + -1);
      iVar4 = (uint)(iVar4 <= iVar3) + iVar4;
      iVar1 = arr[iVar3];
      arr[iVar3] = arr[iVar4];
      arr[iVar4] = iVar1;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[uVar7]);
        std::operator<<(poVar5,' ');
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  return;
}

Assistant:

void Bozo_sort(int* arr, int len, Order type = ABC){
    cout << "BOZO ARR" << endl;
    switch (type) {
        case DESC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 >= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
        case ABC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 <= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
    }
}